

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::UnicodeOperator>
               (string_t *ldata,int *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  char **ppcVar8;
  ulong uVar9;
  ulong uVar10;
  utf8proc_uint8_t *puVar11;
  int *piVar12;
  idx_t iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char **local_78;
  idx_t local_70;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  int *local_58;
  idx_t local_50;
  ValidityMask *local_48;
  ulong local_40;
  int *local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_58 = result_data;
  local_48 = mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &(ldata->value).pointer.ptr;
      iVar13 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_78 + -1);
        local_68._0_4_ = paVar1->length;
        local_68._4_1_ = paVar1->prefix[0];
        local_68._5_1_ = paVar1->prefix[1];
        local_68._6_1_ = paVar1->prefix[2];
        local_68._7_1_ = paVar1->prefix[3];
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_78;
        puVar11 = (utf8proc_uint8_t *)p_Stack_60;
        if ((uint)(undefined4)local_68 < 0xd) {
          puVar11 = (utf8proc_uint8_t *)((long)&local_68 + 4);
        }
        utf8proc_iterate(puVar11,(ulong)local_68 & 0xffffffff,(utf8proc_int32_t *)&local_70);
        result_data[iVar13] = (int)local_70;
        iVar13 = iVar13 + 1;
        local_78 = local_78 + 2;
      } while (count != iVar13);
    }
  }
  else {
    local_50 = count;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_70 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_70);
      p_Var5 = p_Stack_60;
      peVar4 = local_68;
      local_68 = (element_type *)0x0;
      p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar4;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < local_50 + 0x3f) {
      local_40 = local_50 + 0x3f >> 6;
      uVar9 = 0;
      uVar10 = 0;
      piVar12 = local_58;
      uVar15 = local_50;
      do {
        puVar2 = (local_48->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar16 = uVar9 + 0x40;
          if (uVar15 <= uVar9 + 0x40) {
            uVar16 = uVar15;
          }
LAB_01b3496a:
          uVar6 = uVar9;
          if (uVar9 < uVar16) {
            ppcVar8 = &ldata[uVar9].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar8 + -1);
              local_68._0_4_ = paVar1->length;
              local_68._4_1_ = paVar1->prefix[0];
              local_68._5_1_ = paVar1->prefix[1];
              local_68._6_1_ = paVar1->prefix[2];
              local_68._7_1_ = paVar1->prefix[3];
              p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppcVar8;
              puVar11 = (utf8proc_uint8_t *)p_Stack_60;
              if ((uint)(undefined4)local_68 < 0xd) {
                puVar11 = (utf8proc_uint8_t *)((long)&local_68 + 4);
              }
              utf8proc_iterate(puVar11,(ulong)local_68 & 0xffffffff,(utf8proc_int32_t *)&local_70);
              piVar12[uVar9] = (int)local_70;
              uVar9 = uVar9 + 1;
              ppcVar8 = ppcVar8 + 2;
              uVar6 = uVar16;
            } while (uVar16 != uVar9);
          }
        }
        else {
          uVar3 = puVar2[uVar10];
          uVar16 = uVar9 + 0x40;
          if (uVar15 <= uVar9 + 0x40) {
            uVar16 = uVar15;
          }
          uVar6 = uVar16;
          if (uVar3 != 0) {
            if (uVar3 == 0xffffffffffffffff) goto LAB_01b3496a;
            piVar12 = local_58;
            uVar15 = local_50;
            uVar6 = uVar9;
            if (uVar9 < uVar16) {
              local_38 = local_58 + uVar9;
              ppcVar8 = &ldata[uVar9].value.pointer.ptr;
              uVar14 = 0;
              do {
                if ((uVar3 >> (uVar14 & 0x3f) & 1) != 0) {
                  paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar8 + -1);
                  local_68._0_4_ = paVar1->length;
                  local_68._4_1_ = paVar1->prefix[0];
                  local_68._5_1_ = paVar1->prefix[1];
                  local_68._6_1_ = paVar1->prefix[2];
                  local_68._7_1_ = paVar1->prefix[3];
                  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppcVar8;
                  puVar11 = (utf8proc_uint8_t *)p_Stack_60;
                  if ((uint)(undefined4)local_68 < 0xd) {
                    puVar11 = (utf8proc_uint8_t *)((long)&local_68 + 4);
                  }
                  utf8proc_iterate(puVar11,(ulong)local_68 & 0xffffffff,
                                   (utf8proc_int32_t *)&local_70);
                  local_38[uVar14] = (int)local_70;
                }
                uVar14 = uVar14 + 1;
                ppcVar8 = ppcVar8 + 2;
                piVar12 = local_58;
                uVar15 = local_50;
                uVar6 = uVar16;
              } while (uVar16 - uVar9 != uVar14);
            }
          }
        }
        uVar9 = uVar6;
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_40);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}